

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.h
# Opt level: O2

string * __thiscall dynet::Dict::convert_abi_cxx11_(Dict *this,int *id)

{
  pointer pbVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  string asStack_1b8 [32];
  ostringstream oss;
  
  pbVar1 = (this->words_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*id < (int)((ulong)((long)(this->words_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5)) {
    return pbVar1 + *id;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Out-of-bounds error in Dict::convert for word ID ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*id);
  poVar2 = std::operator<<(poVar2," (dict size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline const std::string& convert(const int& id) const {
    DYNET_ARG_CHECK(id < (int)words_.size(), 
                            "Out-of-bounds error in Dict::convert for word ID " << id <<
                            " (dict size: " << words_.size() << ")");
    return words_[id];
  }